

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O1

void __thiscall r_exec::HLPController::add_requirement(HLPController *this,bool strong)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &(this->super_OController).super_Controller.m_reductionMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    (&this->strong_requirement_count)[!strong] = (&this->strong_requirement_count)[!strong] + 1;
    this->requirement_count = this->requirement_count + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void HLPController::add_requirement(bool strong)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);

    if (strong) {
        ++strong_requirement_count;
    } else {
        ++weak_requirement_count;
    }

    ++requirement_count;
}